

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

bool __thiscall
SQCompilation::NodeEqualChecker::cmpSwitch
          (NodeEqualChecker *this,SwitchStatement *l,SwitchStatement *r)

{
  SwitchCase *pSVar1;
  SwitchCase *pSVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  
  bVar3 = check(this,&l->_expr->super_Node,&r->_expr->super_Node);
  if ((!bVar3) || ((l->_cases)._size != (r->_cases)._size)) {
    return false;
  }
  if ((l->_cases)._size != 0) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      pSVar1 = (l->_cases)._vals;
      pSVar2 = (r->_cases)._vals;
      bVar3 = check(this,*(Node **)((long)pSVar1 + lVar4 + -8),*(Node **)((long)pSVar2 + lVar4 + -8)
                   );
      if (!bVar3) {
        return false;
      }
      bVar3 = check(this,*(Node **)((long)&pSVar1->val + lVar4),
                    *(Node **)((long)&pSVar2->val + lVar4));
      if (!bVar3) {
        return false;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (l->_cases)._size);
  }
  bVar3 = check(this,&((l->_defaultCase).stmt)->super_Node,&((r->_defaultCase).stmt)->super_Node);
  return bVar3;
}

Assistant:

bool cmpSwitch(const SwitchStatement *l, const SwitchStatement *r) const {
    if (!check(l->expression(), r->expression()))
      return false;

    const auto &lcases = l->cases();
    const auto &rcases = r->cases();

    if (lcases.size() != rcases.size())
      return false;

    for (int32_t i = 0; i < lcases.size(); ++i) {
      const auto &lc = lcases[i];
      const auto &rc = rcases[i];

      if (!check(lc.val, rc.val))
        return false;

      if (!check(lc.stmt, rc.stmt))
        return false;
    }

    return check(l->defaultCase().stmt, r->defaultCase().stmt);
  }